

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplesignal.h
# Opt level: O2

void __thiscall
Simple::Lib::ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>::SignalLink::
decref(SignalLink *this)

{
  int *piVar1;
  
  piVar1 = &this->ref_count;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 != 0) {
    return;
  }
  Catch::clara::std::_Function_base::~_Function_base(&(this->function).super__Function_base);
  operator_delete(this);
  return;
}

Assistant:

void decref() {
      ref_count -= 1;
      if (!ref_count)
        delete this;
      else
        assert(ref_count > 0);
    }